

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O0

int Int_ManProcessRoots(Int_Man_t *p)

{
  int iVar1;
  Sto_Cls_t *pConflict;
  bool bVar2;
  int local_24;
  Sto_Cls_t *pSStack_20;
  int Counter;
  Sto_Cls_t *pClause;
  Int_Man_t *p_local;
  
  local_24 = 0;
  for (pSStack_20 = p->pCnf->pHead; pSStack_20 != (Sto_Cls_t *)0x0; pSStack_20 = pSStack_20->pNext)
  {
    if ((*(uint *)&pSStack_20->field_0x1c & 1) != (uint)(local_24 < p->pCnf->nClausesA)) {
      __assert_fail("(int)pClause->fA == (Counter < (int)p->pCnf->nClausesA)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                    ,0x374,"int Int_ManProcessRoots(Int_Man_t *)");
    }
    if ((*(uint *)&pSStack_20->field_0x1c >> 1 & 1) != (uint)(local_24 < p->pCnf->nRoots)) {
      __assert_fail("(int)pClause->fRoot == (Counter < (int)p->pCnf->nRoots)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                    ,0x375,"int Int_ManProcessRoots(Int_Man_t *)");
    }
    local_24 = local_24 + 1;
  }
  if (p->pCnf->nClauses != local_24) {
    __assert_fail("p->pCnf->nClauses == Counter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                  ,0x378,"int Int_ManProcessRoots(Int_Man_t *)");
  }
  if ((*(uint *)&p->pCnf->pTail->field_0x1c >> 3 & 0xffffff) == 0) {
    p->nTrailSize = 0;
    pSStack_20 = p->pCnf->pHead;
    do {
      bVar2 = false;
      if (pSStack_20 != (Sto_Cls_t *)0x0) {
        bVar2 = (*(uint *)&pSStack_20->field_0x1c >> 1 & 1) != 0;
      }
      if (!bVar2) {
        pConflict = Int_ManPropagate(p,0);
        if (pConflict != (Sto_Cls_t *)0x0) {
          Int_ManProofTraceOne(p,pConflict,p->pCnf->pEmpty);
          if (p->fVerbose != 0) {
            printf("Found root level conflict!\n");
          }
          return 0;
        }
        p->nRootSize = p->nTrailSize;
        return 1;
      }
      if (1 < (*(uint *)&pSStack_20->field_0x1c >> 3 & 0xffffff)) {
        Int_ManWatchClause(p,pSStack_20,*(lit *)&pSStack_20[1].pNext);
        Int_ManWatchClause(p,pSStack_20,*(lit *)((long)&pSStack_20[1].pNext + 4));
      }
      if ((*(uint *)&pSStack_20->field_0x1c >> 3 & 0xffffff) == 1) {
        iVar1 = lit_check(*(lit *)&pSStack_20[1].pNext,p->pCnf->nVars);
        if (iVar1 == 0) {
          __assert_fail("lit_check(pClause->pLits[0], p->pCnf->nVars)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                        ,0x38b,"int Int_ManProcessRoots(Int_Man_t *)");
        }
        iVar1 = Int_ManEnqueue(p,*(lit *)&pSStack_20[1].pNext,pSStack_20);
        if (iVar1 == 0) {
          Int_ManProofTraceOne(p,pSStack_20,p->pCnf->pEmpty);
          if (p->fVerbose != 0) {
            printf("Found root level conflict!\n");
          }
          return 0;
        }
      }
      pSStack_20 = pSStack_20->pNext;
    } while( true );
  }
  __assert_fail("p->pCnf->pTail->nLits == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                ,0x37b,"int Int_ManProcessRoots(Int_Man_t *)");
}

Assistant:

int Int_ManProcessRoots( Int_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Counter;

    // make sure the root clauses are preceeding the learnt clauses
    Counter = 0;
    Sto_ManForEachClause( p->pCnf, pClause )
    {
        assert( (int)pClause->fA    == (Counter < (int)p->pCnf->nClausesA) );
        assert( (int)pClause->fRoot == (Counter < (int)p->pCnf->nRoots)    );
        Counter++;
    }
    assert( p->pCnf->nClauses == Counter );

    // make sure the last clause if empty
    assert( p->pCnf->pTail->nLits == 0 );

    // go through the root unit clauses
    p->nTrailSize = 0;
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        // create watcher lists for the root clauses
        if ( pClause->nLits > 1 )
        {
            Int_ManWatchClause( p, pClause, pClause->pLits[0] );
            Int_ManWatchClause( p, pClause, pClause->pLits[1] );
        }
        // empty clause and large clauses
        if ( pClause->nLits != 1 )
            continue;
        // unit clause
        assert( lit_check(pClause->pLits[0], p->pCnf->nVars) );
        if ( !Int_ManEnqueue( p, pClause->pLits[0], pClause ) )
        {
            // detected root level conflict
//            printf( "Error in Int_ManProcessRoots(): Detected a root-level conflict too early!\n" );
//            assert( 0 );
            // detected root level conflict
            Int_ManProofTraceOne( p, pClause, p->pCnf->pEmpty );
            if ( p->fVerbose )
                printf( "Found root level conflict!\n" );
            return 0;
        }
    }

    // propagate the root unit clauses
    pClause = Int_ManPropagate( p, 0 );
    if ( pClause )
    {
        // detected root level conflict
        Int_ManProofTraceOne( p, pClause, p->pCnf->pEmpty );
        if ( p->fVerbose )
            printf( "Found root level conflict!\n" );
        return 0;
    }

    // set the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}